

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

string * units::definedUnitsFromFile(string *__return_storage_ptr__,string *filename)

{
  char cVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char cVar4;
  istream *piVar5;
  long lVar6;
  mapped_type *pmVar7;
  long *plVar8;
  undefined8 *puVar9;
  long *plVar10;
  ulong *puVar11;
  _Alloc_hider _Var12;
  long lVar13;
  bool notfound;
  bool bVar14;
  ulong uVar15;
  string userdef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> meas_string;
  string line;
  precise_measurement meas;
  ifstream infile;
  key_type local_328;
  string *local_308;
  long *local_300;
  long local_2f8;
  long local_2f0 [2];
  double local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  long local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  precise_unit local_2b8;
  long local_2a8;
  long lStack_2a0;
  precise_measurement local_298;
  string local_280;
  long local_260;
  long *local_258 [2];
  long local_248 [2];
  long local_238 [65];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_308 = __return_storage_ptr__;
  std::ifstream::ifstream(local_238,(string *)filename,_S_in);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    local_2d8 = &local_2c8;
    local_2d0 = 0;
    local_2c8._M_allocated_capacity = local_2c8._M_allocated_capacity & 0xffffffffffffff00;
LAB_00159129:
    do {
      cVar4 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_2d8,cVar4);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) goto LAB_0015977d;
      lVar6 = std::__cxx11::string::find_first_not_of((char *)&local_2d8,0x17972e,0);
      if (lVar6 != -1) {
        cVar4 = local_2d8->_M_local_buf[lVar6];
        if (cVar4 == '\'') {
LAB_001591a7:
          bVar14 = true;
          do {
            lVar13 = std::__cxx11::string::find
                               ((char)(string *)&local_2d8,
                                (ulong)(uint)(int)local_2d8->_M_local_buf[lVar6]);
            if (lVar13 == -1) {
              lVar13 = 1;
              break;
            }
            if (local_2d8->_M_local_buf[lVar13 + -1] == '\\') {
              std::__cxx11::string::erase((ulong)&local_2d8,lVar13 - 1);
            }
            else {
              bVar14 = false;
            }
            lVar13 = lVar13 - lVar6;
          } while (bVar14);
        }
        else {
          if (cVar4 == '#') goto LAB_00159129;
          lVar13 = 1;
          if (cVar4 == '\"') goto LAB_001591a7;
        }
        lVar6 = std::__cxx11::string::find_first_of((char *)&local_2d8,0x179732,lVar13 + lVar6);
        if (lVar6 == -1) {
          local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_328,local_2d8,(char *)(local_2d0 + (long)local_2d8));
          std::__cxx11::string::append((char *)&local_328);
          std::__cxx11::string::_M_append((char *)local_308,(ulong)local_328._M_dataplus._M_p);
        }
        else {
          if (lVar6 == local_2d0 + -1) {
            local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_328,local_2d8,(char *)(local_2d0 + (long)local_2d8));
            std::__cxx11::string::append((char *)&local_328);
            std::__cxx11::string::_M_append((char *)local_308,(ulong)local_328._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_328._M_dataplus._M_p != &local_328.field_2) {
              operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1
                             );
            }
          }
          uVar15 = 1;
          if (1 < (byte)(local_2d8->_M_local_buf[lVar6 + 1] - 0x3dU)) {
            uVar15 = (ulong)(local_2d8->_M_local_buf[lVar6 + -1] == '<');
            if (local_2d8->_M_local_buf[lVar6 + -1] == '<') {
              lVar6 = lVar6 + -1;
            }
          }
          std::__cxx11::string::substr((ulong)&local_328,(ulong)&local_2d8);
          while (local_328._M_dataplus._M_p[local_328._M_string_length - 1] == ' ') {
            std::__cxx11::string::pop_back();
          }
          cVar4 = *local_328._M_dataplus._M_p;
          if (((cVar4 == '\'') || (cVar4 == '\"')) &&
             (local_328._M_dataplus._M_p[local_328._M_string_length - 1] == cVar4)) {
            std::__cxx11::string::pop_back();
            std::__cxx11::string::_M_erase((ulong)&local_328,0);
          }
          if (local_328._M_string_length == 0) {
            local_300 = local_2f0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_300,local_2d8,(char *)(local_2d0 + (long)local_2d8));
            std::__cxx11::string::append((char *)&local_300);
            std::__cxx11::string::_M_append((char *)local_308,(ulong)local_300);
          }
          else {
            lVar13 = std::__cxx11::string::find_first_not_of
                               ((char *)&local_2d8,0x1797ab,uVar15 + lVar6 + 1);
            if (lVar13 == -1) {
              local_300 = local_2f0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_300,local_2d8,(char *)(local_2d0 + (long)local_2d8));
              std::__cxx11::string::append((char *)&local_300);
              std::__cxx11::string::_M_append((char *)local_308,(ulong)local_300);
            }
            else {
              std::__cxx11::string::substr((ulong)&local_300,(ulong)&local_2d8);
              while (cVar4 = *(char *)((long)local_300 + local_2f8 + -1), cVar4 == ' ') {
                std::__cxx11::string::pop_back();
              }
              cVar1 = (char)*local_300;
              local_260 = lVar13;
              if (((cVar1 == '\'') || (cVar1 == '\"')) && (cVar4 == cVar1)) {
                std::__cxx11::string::pop_back();
                std::__cxx11::string::_M_erase((ulong)&local_300,0);
              }
              local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_280,local_300,(char *)((long)local_300 + local_2f8));
              measurement_from_string(&local_298,&local_280,defaultMatchFlags);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_280._M_dataplus._M_p != &local_280.field_2) {
                operator_delete(local_280._M_dataplus._M_p,
                                local_280.field_2._M_allocated_capacity + 1);
              }
              uVar2 = local_298.units_._8_8_;
              local_2e0 = local_298.units_.multiplier_;
              if (((local_298.units_.base_units_ == -0x56b5b78 && NAN(local_298.units_.multiplier_))
                  || (NAN(local_298.units_.multiplier_))) ||
                 ((local_298.units_.base_units_ == -0x56b5b78 || (NAN(local_298.value_))))) {
                std::__cxx11::string::substr((ulong)local_258,(ulong)&local_2d8);
                plVar8 = (long *)std::__cxx11::string::append((char *)local_258);
                local_2b8.multiplier_ = (double)&local_2a8;
                plVar10 = plVar8 + 2;
                if ((long *)*plVar8 == plVar10) {
                  local_2a8 = *plVar10;
                  lStack_2a0 = plVar8[3];
                }
                else {
                  local_2a8 = *plVar10;
                  local_2b8.multiplier_ = (double)*plVar8;
                }
                local_2b8._8_8_ = plVar8[1];
                *plVar8 = (long)plVar10;
                plVar8[1] = 0;
                *(undefined1 *)(plVar8 + 2) = 0;
                std::__cxx11::string::_M_append((char *)local_308,(ulong)local_2b8.multiplier_);
                if ((long *)local_2b8.multiplier_ != &local_2a8) {
                  operator_delete((void *)local_2b8.multiplier_,local_2a8 + 1);
                }
                if (local_258[0] != local_248) {
                  operator_delete(local_258[0],local_248[0] + 1);
                }
              }
              else if (local_2d8->_M_local_buf[uVar15 + lVar6] == '>') {
                local_2e0 = local_298.units_.multiplier_ * local_298.value_;
                if ((_ZN5unitsL21allowUserDefinedUnitsE_0 & 1) != 0) {
                  pmVar7 = std::__detail::
                           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                         *)user_defined_units_abi_cxx11_,&local_328);
                  uVar3 = local_298.units_._8_8_;
                  pmVar7->multiplier_ = local_2e0;
                  local_298.units_.base_units_ = SUB84(uVar2,0);
                  local_298.units_.commodity_ = SUB84(uVar2,4);
                  pmVar7->base_units_ = local_298.units_.base_units_;
                  pmVar7->commodity_ = local_298.units_.commodity_;
                  _ZN5unitsL21allowUserDefinedUnitsE_0 = _ZN5unitsL21allowUserDefinedUnitsE_0 & 1;
                  local_298.units_._8_8_ = uVar3;
                }
              }
              else if (local_2d8->_M_local_buf[lVar6] == '<') {
                local_2b8.multiplier_ = local_298.units_.multiplier_ * local_298.value_;
                local_2b8.base_units_ = local_298.units_.base_units_;
                local_2b8.commodity_ = local_298.units_.commodity_;
                addUserDefinedOutputUnit(&local_328,&local_2b8);
              }
              else {
                local_2b8.multiplier_ = local_298.units_.multiplier_ * local_298.value_;
                local_2b8.base_units_ = local_298.units_.base_units_;
                local_2b8.commodity_ = local_298.units_.commodity_;
                addUserDefinedUnit(&local_328,&local_2b8);
              }
            }
          }
          if (local_300 != local_2f0) {
            operator_delete(local_300,local_2f0[0] + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
        }
      }
    } while( true );
  }
  std::operator+(&local_328,"unable to read file ",filename);
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_328);
  puVar11 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_2c8._M_allocated_capacity = *puVar11;
    local_2c8._8_8_ = puVar9[3];
    local_2d8 = &local_2c8;
  }
  else {
    local_2c8._M_allocated_capacity = *puVar11;
    local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9;
  }
  local_2d0 = puVar9[1];
  *puVar9 = puVar11;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  std::__cxx11::string::operator=((string *)local_308,(string *)&local_2d8);
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8,local_2c8._M_allocated_capacity + 1);
  }
  _Var12._M_p = local_328._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p == &local_328.field_2) goto LAB_001597f5;
LAB_001597ed:
  operator_delete(_Var12._M_p,local_328.field_2._M_allocated_capacity + 1);
LAB_001597f5:
  std::ifstream::~ifstream(local_238);
  return local_308;
LAB_0015977d:
  local_328.field_2._M_allocated_capacity = local_2c8._M_allocated_capacity;
  _Var12._M_p = (pointer)local_2d8;
  if (local_2d8 == &local_2c8) goto LAB_001597f5;
  goto LAB_001597ed;
}

Assistant:

std::string definedUnitsFromFile(const std::string& filename) noexcept
{
    std::string output;
    try {
        std::ifstream infile(filename);
        if (!infile.is_open()) {
            output = "unable to read file " + filename + "\n";
            return output;
        }
        std::string line;
        while (std::getline(infile, line)) {
            auto commentloc = line.find_first_not_of(" \t\n");
            if (commentloc == std::string::npos || line[commentloc] == '#') {
                continue;
            }
            std::size_t esep{1};  // extra separation location to handle quotes
            if (line[commentloc] == '\"' || line[commentloc] == '\'') {
                bool notfound{true};
                while (notfound) {
                    esep =
                        line.find_first_of(line[commentloc], commentloc + esep);
                    if (esep == std::string::npos) {
                        esep = 1;
                        break;
                    }
                    if (line[esep - 1] != '\\') {
                        notfound = false;
                    } else {
                        // remove the escaped quote
                        line.erase(esep - 1, 1);
                    }
                    esep -= commentloc;
                }
            }
            auto sep = line.find_first_of(",;=", commentloc + esep);
            if (sep == std::string::npos) {
                output +=
                    line + " is not a valid user defined unit definition\n";
                continue;
            }
            if (sep == line.size() - 1) {
                output += line + " does not have any valid definitions\n";
            }
            int length{0};
            if (line[sep + 1] == '=' || line[sep + 1] == '>') {
                length = 1;
            }
            if (length == 0 && line[sep - 1] == '<') {
                length = 1;
                --sep;
            }
            // get the new definition name
            std::string userdef = line.substr(commentloc, sep - commentloc);
            while (userdef.back() == ' ') {
                userdef.pop_back();
            }
            // remove quotes
            if ((userdef.front() == '\"' || userdef.front() == '\'') &&
                userdef.back() == userdef.front()) {
                userdef.pop_back();
                userdef.erase(userdef.begin());
            }
            if (userdef.empty()) {
                output += line + " does not specify a user string\n";
                continue;
            }
            // the unit string
            auto sloc = line.find_first_not_of(" \t", sep + length + 1);
            if (sloc == std::string::npos) {
                output += line + " does not specify a unit definition string\n";
                continue;
            }
            auto meas_string = line.substr(sloc);
            while (meas_string.back() == ' ') {
                meas_string.pop_back();
            }
            if ((meas_string.front() == '\"' || meas_string.front() == '\'') &&
                meas_string.back() == meas_string.front()) {
                meas_string.pop_back();
                meas_string.erase(meas_string.begin());
            }
            auto meas = measurement_from_string(meas_string);
            if (!is_valid(meas)) {
                output +=
                    line.substr(sloc) + " does not generate a valid unit\n";
                continue;
            }

            if (line[sep + length] == '>') {
                addUserDefinedInputUnit(userdef, meas.as_unit());
            } else if (line[sep] == '<') {
                addUserDefinedOutputUnit(userdef, meas.as_unit());
            } else {
                addUserDefinedUnit(userdef, meas.as_unit());
            }
        }
    }
    // LCOV_EXCL_START
    catch (const std::exception& e) {
        output += e.what();
        output.push_back('\n');
        // this is mainly just to catch any weird errors coming from somewhere
        // so this function can be noexcept
    }
    // LCOV_EXCL_STOP
    return output;
}